

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O3

void (anonymous_namespace)::check<Imf_3_2::DeepScanLineInputFile,Imf_3_2::DeepScanLineOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  void *pvVar8;
  size_t sVar9;
  MultiPartInputFile file_1;
  DeepScanLineOutputFile file;
  Header f;
  MultiPartInputFile aMStack_88 [16];
  long *local_78;
  long local_70;
  long local_68 [2];
  Header local_58 [56];
  
  local_78 = (long *)0x0;
  Imf_3_2::Header::Header(local_58,0x40,0x40,1.0,(Vec2 *)&local_78,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  pcVar4 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&local_78,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar4,(Channel *)"Dummy");
  sVar9 = *(size_t *)(filename + 8);
  if ((sVar9 != DAT_001efe90) ||
     ((sVar9 != 0 &&
      (iVar2 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar9), iVar2 != 0))
     )) {
    Imf_3_2::Header::setType((string *)local_58);
  }
  puVar5 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar5 = 2;
  remove("/var/tmp/badfile.exr");
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
            ((DeepScanLineOutputFile *)&local_78,"/var/tmp/badfile.exr",local_58,iVar2);
  Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile((DeepScanLineOutputFile *)&local_78);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(aMStack_88,"/var/tmp/badfile.exr",iVar2,true);
  sVar9 = DAT_001efe48;
  iVar2 = (int)aMStack_88;
  if (DAT_001efe48 == DAT_001efe90) {
    if (DAT_001efe48 == 0) {
LAB_0012ee5a:
      sVar9 = 0;
    }
    else {
      iVar3 = bcmp(Imf_3_2::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001efe48);
      if (iVar3 != 0) goto LAB_0012ed49;
    }
  }
  else {
LAB_0012ed49:
    Imf_3_2::MultiPartInputFile::header(iVar2);
    puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar9 = puVar6[1];
    if (sVar9 == DAT_001efe48) {
      if (sVar9 == 0) goto LAB_0012ee5a;
      iVar3 = bcmp((void *)*puVar6,Imf_3_2::DEEPSCANLINE_abi_cxx11_,sVar9);
      if (iVar3 == 0) goto LAB_0012eedc;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,Imf_3_2::DEEPSCANLINE_abi_cxx11_,DAT_001efe48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
    Imf_3_2::MultiPartInputFile::header(iVar2);
    puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," from multipart when input type was ",0x24);
    sVar9 = *(size_t *)(filename + 8);
    if (sVar9 == DAT_001efe90) {
      if (sVar9 != 0) {
        pvVar8 = *(void **)filename;
        iVar3 = bcmp(pvVar8,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar9);
        if (iVar3 != 0) goto LAB_0012ee62;
      }
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"unset","");
    }
    else {
      pvVar8 = *(void **)filename;
LAB_0012ee62:
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char*>((string *)&local_78,pvVar8,sVar9 + (long)pvVar8);
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_78,local_70);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    sVar9 = DAT_001efe48;
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
      sVar9 = DAT_001efe48;
    }
  }
LAB_0012eedc:
  if ((sVar9 != DAT_001efe90) ||
     ((sVar9 != 0 &&
      (iVar3 = bcmp(Imf_3_2::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar9)
      , iVar3 != 0)))) {
    Imf_3_2::MultiPartInputFile::header(iVar2);
    puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar9 = puVar6[1];
    if ((sVar9 != DAT_001efe48) ||
       ((sVar9 != 0 &&
        (iVar2 = bcmp((void *)*puVar6,Imf_3_2::DEEPSCANLINE_abi_cxx11_,sVar9), iVar2 != 0)))) {
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::DeepScanLineInputFile, OUT = Imf_3_2::DeepScanLineOutputFile]"
                   );
    }
  }
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(aMStack_88);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
            ((DeepScanLineInputFile *)aMStack_88,"/var/tmp/badfile.exr",iVar2);
  if ((DAT_001efe48 == DAT_001efe90) &&
     ((DAT_001efe48 == 0 ||
      (iVar2 = bcmp(Imf_3_2::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                    DAT_001efe48), iVar2 == 0)))) {
    Imf_3_2::DeepScanLineInputFile::header();
    cVar1 = Imf_3_2::Header::hasType();
    if (cVar1 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_2::DeepScanLineInputFile::header();
    cVar1 = Imf_3_2::Header::hasType();
    if (cVar1 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::DeepScanLineInputFile, OUT = Imf_3_2::DeepScanLineOutputFile]"
                   );
    }
    goto LAB_0012f183;
  }
  Imf_3_2::DeepScanLineInputFile::header();
  puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  sVar9 = puVar6[1];
  if ((sVar9 == DAT_001efe48) &&
     ((sVar9 == 0 ||
      (iVar2 = bcmp((void *)*puVar6,Imf_3_2::DEEPSCANLINE_abi_cxx11_,sVar9), iVar2 == 0))))
  goto LAB_0012f183;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,Imf_3_2::DEEPSCANLINE_abi_cxx11_,DAT_001efe48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," but got ",9);
  Imf_3_2::DeepScanLineInputFile::header();
  puVar6 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," when input type was ",0x15);
  sVar9 = *(size_t *)(filename + 8);
  if (sVar9 == DAT_001efe90) {
    if (sVar9 != 0) {
      pvVar8 = *(void **)filename;
      iVar2 = bcmp(pvVar8,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar9);
      if (iVar2 != 0) goto LAB_0012f110;
    }
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"unset","");
  }
  else {
    pvVar8 = *(void **)filename;
LAB_0012f110:
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char*>((string *)&local_78,pvVar8,sVar9 + (long)pvVar8);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_78,local_70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
LAB_0012f183:
  Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)aMStack_88);
  remove("/var/tmp/badfile.exr");
  Imf_3_2::Header::~Header(local_58);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}